

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

void __thiscall
cmSourceFileLocation::cmSourceFileLocation
          (cmSourceFileLocation *this,cmMakefile *mf,string *name,cmSourceFileLocationKind kind)

{
  bool bVar1;
  string local_98;
  string local_78;
  string local_58;
  cmSourceFileLocationKind local_24;
  string *psStack_20;
  cmSourceFileLocationKind kind_local;
  string *name_local;
  cmMakefile *mf_local;
  cmSourceFileLocation *this_local;
  
  this->Makefile = mf;
  this->AmbiguousDirectory = true;
  this->AmbiguousExtension = true;
  local_24 = kind;
  psStack_20 = name;
  name_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  std::__cxx11::string::string((string *)&this->Directory);
  std::__cxx11::string::string((string *)&this->Name);
  bVar1 = cmsys::SystemTools::FileIsFullPath(psStack_20);
  this->AmbiguousDirectory = (bool)(~bVar1 & 1);
  this->AmbiguousExtension = true;
  cmsys::SystemTools::GetFilenamePath(&local_58,psStack_20);
  std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = cmsys::SystemTools::FileIsFullPath(&this->Directory);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&local_78,&this->Directory);
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  cmsys::SystemTools::GetFilenameName(&local_98,psStack_20);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (local_24 == Known) {
    DirectoryUseSource(this);
    this->AmbiguousExtension = false;
  }
  else {
    UpdateExtension(this,psStack_20);
  }
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation(cmMakefile const* mf,
                                           const std::string& name,
                                           cmSourceFileLocationKind kind)
  : Makefile(mf)
{
  this->AmbiguousDirectory = !cmSystemTools::FileIsFullPath(name);
  this->AmbiguousExtension = true;
  this->Directory = cmSystemTools::GetFilenamePath(name);
  if (cmSystemTools::FileIsFullPath(this->Directory)) {
    this->Directory = cmSystemTools::CollapseFullPath(this->Directory);
  }
  this->Name = cmSystemTools::GetFilenameName(name);
  if (kind == cmSourceFileLocationKind::Known) {
    this->DirectoryUseSource();
    this->AmbiguousExtension = false;
  } else {
    this->UpdateExtension(name);
  }
}